

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  uint nData;
  long iStart;
  MergeEngine *pMVar1;
  PmaReader *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  u64 v;
  long in_FS_OFFSET;
  int dummy;
  PmaWriter writer;
  int local_7c;
  undefined1 *local_78;
  u8 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  sqlite3_file *psStack_50;
  undefined1 *local_48;
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iStart = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (sqlite3_file *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  vdbePmaWriterInit(pIncr->aFile[1].pFd,(PmaWriter *)&local_78,pIncr->pTask->pSorter->pgsz,iStart);
  iVar4 = 0;
  do {
    if (iVar4 != 0) break;
    local_7c = -0x55555556;
    pPVar2 = pMVar1->aReadr;
    iVar5 = pMVar1->aTree[1];
    if (pPVar2[iVar5].pFd == (sqlite3_file *)0x0) {
      iVar4 = 0;
      bVar3 = false;
    }
    else {
      nData = pPVar2[iVar5].nKey;
      v = (u64)(int)nData;
      lVar6 = 1;
      uVar7 = v;
      if (0x7f < nData) {
        do {
          lVar6 = lVar6 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar3);
      }
      iVar4 = 0;
      bVar3 = false;
      if ((long)(local_58 + lVar6 + (long)(int)puStack_60 + v) <= pIncr->mxSz + iStart) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = 0xaaaa;
        iVar4 = sqlite3PutVarint((uchar *)&local_48,v);
        vdbePmaWriteBlob((PmaWriter *)&local_78,(u8 *)&local_48,iVar4);
        vdbePmaWriteBlob((PmaWriter *)&local_78,pPVar2[iVar5].aKey,nData);
        iVar4 = vdbeMergeEngineStep(pIncr->pMerger,&local_7c);
        bVar3 = true;
      }
    }
  } while (bVar3);
  iVar5 = vdbePmaWriterFinish((PmaWriter *)&local_78,&pIncr->aFile[1].iEof);
  if (iVar4 != 0) {
    iVar5 = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}